

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

void __thiscall
BattleWithLandlord::Move
          (BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *pattern)

{
  int iVar1;
  undefined8 in_RAX;
  iterator __position;
  _Base_ptr p_Var2;
  undefined7 uStack_38;
  char x;
  
  if ((pattern->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    _uStack_38 = in_RAX;
    for (p_Var2 = (pattern->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pattern->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      _uStack_38 = CONCAT17((char)p_Var2[1]._M_color,uStack_38);
      iVar1 = this->_side;
      __position = std::
                   _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                   ::find((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                           *)(this->_cards + iVar1),&x);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      erase_abi_cxx11_((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)(this->_cards + iVar1),(const_iterator)__position._M_node);
    }
  }
  this->_side = 1 - this->_side;
  this->_round = this->_round + 1;
  return;
}

Assistant:

void BattleWithLandlord::Move(const multiset<byte> &pattern) {
    if (pattern.size()) {
        for (auto x: pattern) {
            _cards[_side].erase(_cards[_side].find(x));
        }
    }
    _side = 1 - _side;
    ++_round;
}